

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::UniaryOp::UniaryOp(UniaryOp *this,Token *t,int p,int a,int line)

{
  Token local_58;
  int local_24;
  int local_20;
  int line_local;
  int a_local;
  int p_local;
  Token *t_local;
  UniaryOp *this_local;
  
  local_24 = line;
  local_20 = a;
  line_local = p;
  _a_local = t;
  t_local = (Token *)this;
  token::Token::Token(&local_58,t);
  Op::Op(&this->super_Op,&local_58,line_local,local_20,local_24,UniaryOpType);
  token::Token::~Token(&local_58);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__UniaryOp_0014f8c8;
  this->RightOp = (Expr *)0x0;
  return;
}

Assistant:

UniaryOp(Token &t, int p, int a , int line)
        :Op(t, p, a, line, NodeType::UniaryOpType), RightOp{nullptr} {}